

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O2

void __thiscall cppmetrics::ScheduledReporter::loop_while_running(ScheduledReporter *this)

{
  byte bVar1;
  cv_status cVar2;
  long lVar3;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  next_report_time;
  unique_lock<std::mutex> lock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  unique_lock<std::mutex> local_38;
  
  do {
    lVar3 = std::chrono::_V2::system_clock::now();
    local_40.__d.__r = (duration)(lVar3 + (this->m_interval).__r);
    std::unique_lock<std::mutex>::unique_lock(&local_38,&this->m_mutex);
LAB_00122675:
    bVar1 = this->m_is_running;
    if ((bool)bVar1 == true) {
      lVar3 = std::chrono::_V2::system_clock::now();
      if ((long)local_40.__d.__r <= lVar3) {
        bVar1 = this->m_is_running;
        goto LAB_001226a6;
      }
      do {
        if (this->m_is_running != true) break;
        cVar2 = std::condition_variable::
                __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          (&this->m_cv,&local_38,&local_40);
      } while (cVar2 != timeout);
      goto LAB_00122675;
    }
LAB_001226a6:
    if ((bVar1 & 1) == 0) {
      std::unique_lock<std::mutex>::~unique_lock(&local_38);
      return;
    }
    std::unique_lock<std::mutex>::unlock(&local_38);
    (*(this->super_Reporter)._vptr_Reporter[2])(this);
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
  } while( true );
}

Assistant:

void ScheduledReporter::loop_while_running()
{
  while (true)
  {
    auto start = std::chrono::system_clock::now();
    auto next_report_time = start + m_interval;

    std::unique_lock<std::mutex> lock(m_mutex);

    while (m_is_running && next_report_time > std::chrono::system_clock::now())
    {
      m_cv.wait_until(lock, next_report_time, [&]() {
        // Predicate returns 'false' if waiting should continue.
        // We want to stop waiting if we have ceased running,
        // and to continue waiting while we are running.
        return !m_is_running;
      });
    }

    if (!m_is_running)
    {
      return;
    }

    lock.unlock();
    report();
  }
}